

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

bool __thiscall
absl::lts_20250127::container_internal::
btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
::Equals(btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
         *this,const_iterator other)

{
  bool bVar1;
  btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *node_b;
  btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *node_a;
  anon_class_1_0_00000001 local_19;
  
  node_b = other.node_;
  node_a = this->node_;
  if (node_a == (btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                 *)0x0 &&
      node_b == (btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                 *)0x0) {
    node_a = (btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
              *)0x0;
  }
  else if ((node_a == (btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                       *)0x0) ||
          (node_b == (btree_node<absl::lts_20250127::container_internal::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                      *)0x0)) {
    Equals::anon_class_1_0_00000001::operator()(&local_19);
    node_a = this->node_;
  }
  bVar1 = AreNodesFromSameContainer<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<int,std::less<int>,std::allocator<int>,256,false>>>
                    (node_a,node_b);
  if (bVar1) {
    return this->position_ == other.position_ && this->node_ == node_b;
  }
  __assert_fail("AreNodesFromSameContainer(node_, other.node_) && \"Comparing iterators from different containers.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                ,0x4e2,
                "bool absl::container_internal::btree_iterator<const absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>>, const int &, const int *>::Equals(const const_iterator) const [Node = const absl::container_internal::btree_node<absl::container_internal::set_params<int, std::less<int>, std::allocator<int>, 256, false>>, Reference = const int &, Pointer = const int *]"
               );
}

Assistant:

bool Equals(const const_iterator other) const {
    ABSL_HARDENING_ASSERT(((node_ == nullptr && other.node_ == nullptr) ||
                           (node_ != nullptr && other.node_ != nullptr)) &&
                          "Comparing default-constructed iterator with "
                          "non-default-constructed iterator.");
    // Note: we use assert instead of ABSL_HARDENING_ASSERT here because this
    // changes the complexity of Equals from O(1) to O(log(N) + log(M)) where
    // N/M are sizes of the containers containing node_/other.node_.
    assert(AreNodesFromSameContainer(node_, other.node_) &&
           "Comparing iterators from different containers.");
    assert_valid_generation(node_);
    other.assert_valid_generation(other.node_);
    return node_ == other.node_ && position_ == other.position_;
  }